

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O0

uint addChunk_cICP(ucvector *out,LodePNGInfo *info)

{
  size_t in_RSI;
  ucvector *in_RDI;
  uint error;
  uchar *chunk;
  uchar *in_stack_ffffffffffffffe0;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  uint uVar1;
  
  if (*(uint *)(in_RSI + 0x118) < 0x100) {
    if (*(uint *)(in_RSI + 0x11c) < 0x100) {
      if (*(uint *)(in_RSI + 0x120) < 0x100) {
        if (*(uint *)(in_RSI + 0x124) < 0x100) {
          uVar1 = lodepng_chunk_init((uchar **)
                                     CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                                     in_RDI,in_RSI,(char *)in_stack_ffffffffffffffe0);
          if (uVar1 == 0) {
            in_stack_ffffffffffffffe0[8] = (uchar)*(undefined4 *)(in_RSI + 0x118);
            in_stack_ffffffffffffffe0[9] = (uchar)*(undefined4 *)(in_RSI + 0x11c);
            in_stack_ffffffffffffffe0[10] = (uchar)*(undefined4 *)(in_RSI + 0x120);
            in_stack_ffffffffffffffe0[0xb] = (uchar)*(undefined4 *)(in_RSI + 0x124);
            lodepng_chunk_generate_crc(in_stack_ffffffffffffffe0);
            uVar1 = 0;
          }
        }
        else {
          uVar1 = 0x74;
        }
      }
      else {
        uVar1 = 0x74;
      }
    }
    else {
      uVar1 = 0x74;
    }
  }
  else {
    uVar1 = 0x74;
  }
  return uVar1;
}

Assistant:

static unsigned addChunk_cICP(ucvector* out, const LodePNGInfo* info) {
  unsigned char* chunk;
  /* Allow up to 255 since they are bytes. The ITU-R-BT.709 spec has a more
  restricted set of valid values for each field, but that's up to the error
  handling of a CICP library, not the PNG encoding/decoding, to manage. */
  if(info->cicp_color_primaries > 255) return 116;
  if(info->cicp_transfer_function > 255) return 116;
  if(info->cicp_matrix_coefficients > 255) return 116;
  if(info->cicp_video_full_range_flag > 255) return 116;
  CERROR_TRY_RETURN(lodepng_chunk_init(&chunk, out, 4, "cICP"));
  chunk[8 + 0] = (unsigned char)info->cicp_color_primaries;
  chunk[8 + 1] = (unsigned char)info->cicp_transfer_function;
  chunk[8 + 2] = (unsigned char)info->cicp_matrix_coefficients;
  chunk[8 + 3] = (unsigned char)info->cicp_video_full_range_flag;
  lodepng_chunk_generate_crc(chunk);
  return 0;
}